

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O0

int list_print(AD *list,char *block_type,int index_base)

{
  ulong uVar1;
  int in_EDX;
  _AD *in_RDI;
  int nblocks;
  AD *ad;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar2;
  
  iVar2 = 0;
  for (; in_RDI != (AD *)0x0; in_RDI = in_RDI->next) {
    ad_print(in_RDI,(char *)CONCAT44(iVar2,in_stack_ffffffffffffffd8));
    printf(":\n");
    printf("\ttype of elements:\t\t%s\n",ma_datatype[in_RDI->datatype]);
    printf("\tnumber of elements:\t\t%ld\n",in_RDI->nelem);
    printf("\taddress of client space:\t0x%lx\n",in_RDI->client_space);
    uVar1 = (long)in_RDI->client_space - (long)ma_base[in_RDI->datatype];
    printf("\tindex for client space:\t\t%ld\n",
           uVar1 / (ulong)(long)ma_sizeof[in_RDI->datatype] + (long)in_EDX,
           uVar1 % (ulong)(long)ma_sizeof[in_RDI->datatype]);
    printf("\ttotal number of bytes:\t\t%lu\n",in_RDI->nbytes);
    iVar2 = iVar2 + 1;
  }
  return iVar2;
}

Assistant:

private int list_print(list, block_type, index_base)
    AD        *list;        /* to print */
    char    *block_type;    /* for output */
    int        index_base;    /* 0 (C) or 1 (FORTRAN) */
{
    AD        *ad;        /* traversal pointer */
    int        nblocks;    /* # of blocks on list */

    /* print each block on list */
    for (ad = list, nblocks = 0; ad; ad = ad->next, nblocks++)
    {
        /* print to stdout */
        ad_print(ad, block_type);
        (void)printf(":\n");
        (void)printf("\ttype of elements:\t\t%s\n",
            ma_datatype[ad->datatype]);
        (void)printf("\tnumber of elements:\t\t%ld\n",
            (size_t)ad->nelem);
        (void)printf("\taddress of client space:\t0x%lx\n",
            (size_t)ad->client_space);
        (void)printf("\tindex for client space:\t\t%ld\n",
            (size_t)(client_space_index(ad) + index_base));
        (void)printf("\ttotal number of bytes:\t\t%lu\n",
            ad->nbytes);
    }

    /* return the number of blocks on list */
    return nblocks;
}